

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall BamTools::ConvertTool::~ConvertTool(ConvertTool *this)

{
  void *in_RDI;
  ConvertTool *unaff_retaddr;
  
  ~ConvertTool(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

ConvertTool::~ConvertTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}